

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.cpp
# Opt level: O2

size_t coda_urlenc(char *dst,char *src,size_t sz_src)

{
  byte bVar1;
  byte *pbVar2;
  byte *pbVar3;
  uchar *psrc;
  uchar *pdst;
  
  pbVar3 = (byte *)(src + sz_src);
  pbVar2 = (byte *)dst;
  for (; src < pbVar3; src = (char *)((byte *)src + 1)) {
    bVar1 = *src;
    if ((table_urlenc[bVar1 >> 5] >> (bVar1 & 0x1f) & 1) == 0) {
      if (bVar1 == 0x20) {
        *pbVar2 = 0x2b;
        pbVar2 = pbVar2 + 1;
      }
      else {
        *pbVar2 = bVar1;
        pbVar2 = pbVar2 + 1;
      }
    }
    else {
      *pbVar2 = 0x25;
      pbVar2[1] = "0123456789ABCDEF"[(byte)*src >> 4];
      pbVar2[2] = "0123456789ABCDEF"[(byte)*src & 0xf];
      pbVar2 = pbVar2 + 3;
    }
  }
  *pbVar2 = 0;
  return (long)pbVar2 - (long)dst;
}

Assistant:

size_t coda_urlenc(char* dst, const char* src, size_t sz_src)
{
	unsigned char* pdst = (unsigned char *) dst;
	unsigned char* psrc = (unsigned char *) src;
	unsigned char* esrc = (unsigned char *) src + sz_src;

	while (psrc < esrc)
	{
		if (table_urlenc[*psrc >> 5] & (1 << (*psrc & 0x1f)))
		{
			*pdst++ = '%';
			*pdst++ = table_hexval[*psrc >> 4];
			*pdst++ = table_hexval[*psrc & 0xf];
			++psrc;
		}
		else if (*psrc == ' ')
		{
			*pdst++ = '+';
			++psrc;
		}
		else
		{
			*pdst++ = *psrc++;
		}
	}

	*pdst = 0;

	return pdst - (unsigned char *) dst;
}